

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O2

DdNode * cuddBddAndRecur(DdManager *manager,DdNode *f,DdNode *g)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  uint index;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  DdNode *pDVar13;
  timespec local_40;
  
  pDVar8 = manager->one;
  pDVar13 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  pDVar11 = (DdNode *)((ulong)g & 0xfffffffffffffffe);
  if (pDVar13 == pDVar11) {
    if (f != g) {
      return (DdNode *)((ulong)pDVar8 ^ 1);
    }
    return f;
  }
  if (pDVar8 == pDVar13) {
    if (pDVar8 == f) {
      return g;
    }
    return f;
  }
  if (pDVar8 == pDVar11) {
    if (pDVar8 != g) {
      return g;
    }
    return f;
  }
  pDVar8 = g;
  pDVar12 = pDVar11;
  if ((long)((ulong)((uint)g & 1) + pDVar11->Id * 2) <
      (long)((ulong)((uint)f & 1) + pDVar13->Id * 2)) {
    pDVar8 = f;
    pDVar12 = pDVar13;
    pDVar13 = pDVar11;
    f = g;
  }
  if (((pDVar13->ref != 1) || (pDVar12->ref != 1)) &&
     (pDVar11 = cuddCacheLookup2(manager,Cudd_bddAnd,f,pDVar8), pDVar11 != (DdNode *)0x0)) {
    return pDVar11;
  }
  if (manager->TimeStop != 0) {
    iVar5 = clock_gettime(3,&local_40);
    if (iVar5 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    if (manager->TimeStop < lVar6) {
      return (DdNode *)0x0;
    }
  }
  uVar2 = pDVar13->index;
  uVar3 = manager->perm[uVar2];
  uVar4 = manager->perm[pDVar12->index];
  pDVar11 = f;
  pDVar9 = f;
  index = pDVar12->index;
  if (uVar3 <= uVar4) {
    pDVar11 = (pDVar13->type).kids.T;
    pDVar9 = (pDVar13->type).kids.E;
    index = uVar2;
    if (((ulong)f & 1) != 0) {
      pDVar11 = (DdNode *)((ulong)pDVar11 ^ 1);
      pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
    }
  }
  pDVar7 = pDVar8;
  pDVar10 = pDVar8;
  if (uVar4 <= uVar3) {
    pDVar7 = (pDVar12->type).kids.T;
    pDVar10 = (pDVar12->type).kids.E;
    if (((ulong)pDVar8 & 1) != 0) {
      pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
      pDVar10 = (DdNode *)((ulong)pDVar10 ^ 1);
    }
  }
  pDVar11 = cuddBddAndRecur(manager,pDVar11,pDVar7);
  if (pDVar11 != (DdNode *)0x0) {
    pDVar7 = (DdNode *)((ulong)pDVar11 & 0xfffffffffffffffe);
    pDVar7->ref = pDVar7->ref + 1;
    pDVar9 = cuddBddAndRecur(manager,pDVar9,pDVar10);
    if (pDVar9 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar10 = pDVar11;
      if (pDVar11 == pDVar9) {
LAB_00657996:
        piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        pDVar7->ref = pDVar7->ref - 1;
        if ((pDVar13->ref == 1) && (pDVar12->ref == 1)) {
          return pDVar10;
        }
        cuddCacheInsert2(manager,Cudd_bddAnd,f,pDVar8,pDVar10);
        return pDVar10;
      }
      if (((ulong)pDVar11 & 1) == 0) {
        pDVar10 = cuddUniqueInter(manager,index,pDVar11,pDVar9);
        if (pDVar10 != (DdNode *)0x0) goto LAB_00657996;
      }
      else {
        pDVar10 = cuddUniqueInter(manager,index,pDVar7,(DdNode *)((ulong)pDVar9 ^ 1));
        if (pDVar10 != (DdNode *)0x0) {
          pDVar10 = (DdNode *)((ulong)pDVar10 ^ 1);
          goto LAB_00657996;
        }
      }
      Cudd_IterDerefBdd(manager,pDVar11);
      pDVar11 = pDVar9;
    }
    Cudd_IterDerefBdd(manager,pDVar11);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddAndRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g)
{
    DdNode *F, *fv, *fnv, *G, *gv, *gnv;
    DdNode *one, *r, *t, *e;
    unsigned int topf, topg, index;

    statLine(manager);
    one = DD_ONE(manager);

    /* Terminal cases. */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    if (F == G) {
        if (f == g) return(f);
        else return(Cudd_Not(one));
    }
    if (F == one) {
        if (f == one) return(g);
        else return(f);
    }
    if (G == one) {
        if (g == one) return(f);
        else return(g);
    }

    /* At this point f and g are not constant. */
    if (cuddF2L(f) > cuddF2L(g)) { /* Try to increase cache efficiency. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
        F = Cudd_Regular(f);
        G = Cudd_Regular(g);
    }

    /* Check cache. */
    if (F->ref != 1 || G->ref != 1) {
        r = cuddCacheLookup2(manager, Cudd_bddAnd, f, g);
        if (r != NULL) return(r);
    }

    if ( manager->TimeStop && Abc_Clock() > manager->TimeStop )
        return NULL;

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    topf = manager->perm[F->index];
    topg = manager->perm[G->index];

    /* Compute cofactors. */
    if (topf <= topg) {
        index = F->index;
        fv = cuddT(F);
        fnv = cuddE(F);
        if (Cudd_IsComplement(f)) {
            fv = Cudd_Not(fv);
            fnv = Cudd_Not(fnv);
        }
    } else {
        index = G->index;
        fv = fnv = f;
    }

    if (topg <= topf) {
        gv = cuddT(G);
        gnv = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gv = Cudd_Not(gv);
            gnv = Cudd_Not(gnv);
        }
    } else {
        gv = gnv = g;
    }

    t = cuddBddAndRecur(manager, fv, gv);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddBddAndRecur(manager, fnv, gnv);
    if (e == NULL) {
        Cudd_IterDerefBdd(manager, t);
        return(NULL);
    }
    cuddRef(e);

    if (t == e) {
        r = t;
    } else {
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(manager,(int)index,Cudd_Not(t),Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(manager,(int)index,t,e);
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
        }
    }
    cuddDeref(e);
    cuddDeref(t);
    if (F->ref != 1 || G->ref != 1)
        cuddCacheInsert2(manager, Cudd_bddAnd, f, g, r);
    return(r);

}